

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::color4f> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::color4f>
          (optional<tinyusdz::value::color4f> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::color4f> local_24;
  
  primvar::PrimVar::get_value<tinyusdz::value::color4f>(&local_24,&this->_var);
  __return_storage_ptr__->has_value_ = local_24.has_value_;
  if (local_24.has_value_ == true) {
    *(undefined8 *)&__return_storage_ptr__->contained = local_24.contained._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_24.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }